

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

void cmDependsFortranParser_RuleModule(cmDependsFortranParser *parser,char *name)

{
  cmDependsFortranSourceInfo *pcVar1;
  allocator local_51;
  string local_50;
  string local_30;
  
  if ((parser->InPPFalseBranch == 0) && (parser->InInterface == false)) {
    pcVar1 = parser->Info;
    std::__cxx11::string::string((string *)&local_30,name,&local_51);
    cmsys::SystemTools::LowerCase(&local_50,&local_30);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&pcVar1->Provides,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void cmDependsFortranParser_RuleModule(cmDependsFortranParser* parser,
                                       const char* name)
{
  if(!parser->InPPFalseBranch && !parser->InInterface)
    {
    parser->Info.Provides.insert(cmSystemTools::LowerCase(name));
    }
}